

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O3

_Bool spell_menu_handler(menu_conflict *m,ui_event *e,wchar_t oid)

{
  long *plVar1;
  
  plVar1 = (long *)menu_priv(m);
  if (e->type == EVT_KBRD) {
    if ((e->key).code == 0x3f) {
      *(byte *)(plVar1 + 3) = *(byte *)(plVar1 + 3) ^ 1;
    }
  }
  else if (e->type == EVT_SELECT) {
    *(undefined4 *)((long)plVar1 + 0x1c) = *(undefined4 *)(*plVar1 + (long)oid * 4);
    return (_Bool)*(undefined1 *)((long)plVar1 + 0xc);
  }
  return false;
}

Assistant:

static bool spell_menu_handler(struct menu *m, const ui_event *e, int oid)
{
	struct spell_menu_data *d = menu_priv(m);

	if (e->type == EVT_SELECT) {
		d->selected_spell = d->spells[oid];
		return d->browse ? true : false;
	}
	else if (e->type == EVT_KBRD) {
		if (e->key.code == '?') {
			d->show_description = !d->show_description;
		}
	}

	return false;
}